

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O1

void dumb_it_optimize_orders(DUMB_IT_SIGDATA *sigdata)

{
  IT_PATTERN *pIVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uchar *puVar5;
  IT_PATTERN *pIVar6;
  void *__base;
  IT_PATTERN *pIVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  IT_PATTERN *pIVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  IT_ENTRY *pIVar18;
  long lVar19;
  int iVar20;
  IT_ENTRY *pIVar21;
  IT_ENTRY *pIVar22;
  size_t __size;
  
  iVar20 = sigdata->n_orders;
  __size = (size_t)iVar20;
  if (((__size == 0) || (iVar4 = sigdata->n_patterns, iVar4 == 0)) ||
     (__base = malloc(__size), __base == (void *)0x0)) {
    return;
  }
  if (iVar20 < 1) {
    uVar12 = 0;
  }
  else {
    puVar5 = sigdata->order;
    sVar8 = 0;
    uVar12 = 0;
    do {
      bVar2 = puVar5[sVar8];
      if ((int)(uint)bVar2 < iVar4) {
        if ((int)uVar12 < 1) {
          uVar14 = 0;
        }
        else {
          uVar13 = 0;
          do {
            uVar14 = uVar13;
            if (bVar2 == *(byte *)((long)__base + uVar13)) break;
            uVar13 = uVar13 + 1;
            uVar14 = (ulong)uVar12;
          } while (uVar12 != uVar13);
        }
        if ((uint)uVar14 == uVar12) {
          lVar15 = (long)(int)uVar12;
          uVar12 = uVar12 + 1;
          *(byte *)((long)__base + lVar15) = bVar2;
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != __size);
  }
  if (uVar12 != 0) {
    uVar14 = (ulong)uVar12;
    if (0 < (int)uVar12) {
      lVar15 = 2;
      uVar9 = 1;
      uVar13 = 0;
      do {
        uVar10 = uVar13 + 1;
        uVar16 = uVar9;
        lVar17 = lVar15;
        if (uVar10 < uVar14) {
          do {
            bVar2 = *(byte *)((long)__base + uVar13);
            bVar3 = *(byte *)((long)__base + uVar16);
            if (bVar2 != bVar3) {
              pIVar7 = sigdata->pattern;
              iVar20 = pIVar7[bVar2].n_entries;
              if (iVar20 == pIVar7[bVar3].n_entries) {
                if (0 < iVar20) {
                  pIVar18 = pIVar7[bVar2].entry;
                  pIVar21 = pIVar18 + iVar20;
                  pIVar22 = pIVar7[bVar3].entry;
                  do {
                    if (((pIVar18->channel < 0x40) || (pIVar22->channel < 0x40)) &&
                       (((((pIVar18->channel != pIVar22->channel ||
                           (bVar2 = pIVar18->mask, bVar2 != pIVar22->mask)) ||
                          (((bVar2 & 1) != 0 && (pIVar18->note != pIVar22->note)))) ||
                         (((bVar2 & 2) != 0 && (pIVar18->instrument != pIVar22->instrument)))) ||
                        ((((bVar2 & 4) != 0 && (pIVar18->volpan != pIVar22->volpan)) ||
                         (((bVar2 & 8) != 0 &&
                          ((pIVar18->effect != pIVar22->effect ||
                           (pIVar18->effectvalue != pIVar22->effectvalue))))))))))
                    goto LAB_006e413f;
                    pIVar18 = pIVar18 + 1;
                    pIVar22 = pIVar22 + 1;
                  } while (pIVar18 < pIVar21);
                }
                if (0 < sigdata->n_orders) {
                  lVar19 = 0;
                  do {
                    if (sigdata->order[lVar19] == *(uchar *)((long)__base + uVar16)) {
                      sigdata->order[lVar19] = *(uchar *)((long)__base + uVar13);
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < sigdata->n_orders);
                }
                iVar20 = (int)uVar16 + 1;
                lVar19 = lVar17;
                while (iVar20 < (int)uVar12) {
                  if (*(char *)((long)__base + lVar19) == *(char *)((long)__base + uVar16)) {
                    *(undefined1 *)((long)__base + lVar19) = *(undefined1 *)((long)__base + uVar13);
                  }
                  lVar19 = lVar19 + 1;
                  iVar20 = (int)lVar19;
                }
                *(undefined1 *)((long)__base + uVar16) = *(undefined1 *)((long)__base + uVar13);
              }
            }
LAB_006e413f:
            uVar16 = uVar16 + 1;
            lVar17 = lVar17 + 1;
          } while (uVar16 != uVar14);
        }
        lVar15 = lVar15 + 1;
        uVar9 = uVar9 + 1;
        uVar13 = uVar10;
      } while (uVar10 != uVar14);
    }
    qsort(__base,(long)(int)uVar12,1,it_order_compare);
    if ((int)uVar12 < 1) {
      iVar20 = 0;
    }
    else {
      uVar13 = 0;
      iVar20 = 0;
      do {
        if (*(char *)((long)__base + uVar13) != *(char *)((long)__base + (long)iVar20)) {
          lVar15 = (long)iVar20 + 1;
          iVar20 = (int)lVar15;
          if ((long)iVar20 < (long)uVar13) {
            *(char *)((long)__base + lVar15) = *(char *)((long)__base + uVar13);
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
    pIVar7 = (IT_PATTERN *)malloc((long)iVar20 * 0x10 + 0x10);
    if (pIVar7 != (IT_PATTERN *)0x0) {
      uVar12 = iVar20 + 1;
      uVar14 = (ulong)uVar12;
      if (-1 < iVar20) {
        pIVar6 = sigdata->pattern;
        uVar13 = 0;
        pIVar11 = pIVar7;
        do {
          pIVar1 = pIVar6 + *(byte *)((long)__base + uVar13);
          iVar4 = pIVar1->n_entries;
          pIVar18 = pIVar1->entry;
          pIVar11->n_rows = pIVar1->n_rows;
          pIVar11->n_entries = iVar4;
          pIVar11->entry = pIVar18;
          uVar13 = uVar13 + 1;
          pIVar11 = pIVar11 + 1;
        } while (uVar14 != uVar13);
      }
      if (0 < sigdata->n_patterns) {
        uVar13 = 0;
        do {
          uVar9 = 0;
          if (-1 < iVar20) {
            uVar16 = 0;
            do {
              uVar9 = uVar16;
              if (uVar13 == *(byte *)((long)__base + uVar16)) break;
              uVar16 = uVar16 + 1;
              uVar9 = uVar14;
            } while (uVar14 != uVar16);
          }
          if (((uint)uVar9 == uVar12) &&
             (pIVar18 = sigdata->pattern[uVar13].entry, pIVar18 != (IT_ENTRY *)0x0)) {
            free(pIVar18);
          }
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)sigdata->n_patterns);
      }
      free(sigdata->pattern);
      sigdata->pattern = pIVar7;
      sigdata->n_patterns = uVar12;
      if (0 < sigdata->n_orders) {
        lVar15 = 0;
        do {
          if (-1 < iVar20) {
            uVar13 = 0;
            do {
              if (sigdata->order[lVar15] == *(uchar *)((long)__base + uVar13)) {
                sigdata->order[lVar15] = (uchar)uVar13;
                break;
              }
              uVar13 = uVar13 + 1;
            } while (uVar14 != uVar13);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < sigdata->n_orders);
      }
    }
  }
  free(__base);
  return;
}

Assistant:

static void dumb_it_optimize_orders(DUMB_IT_SIGDATA * sigdata) {
	int n, o, p;

    /*int last_invalid = (sigdata->flags & IT_WAS_AN_XM) ? 255 : 253;*/

	unsigned char * order_list;
	int n_patterns;

	IT_PATTERN * pattern;

	if (!sigdata->n_orders || !sigdata->n_patterns) return;

	n_patterns = 0;
	order_list = malloc(sigdata->n_orders);

	if (!order_list) return;

	for (n = 0; n < sigdata->n_orders; n++) {
		if (sigdata->order[n] < sigdata->n_patterns) {
			for (o = 0; o < n_patterns; o++) {
				if (sigdata->order[n] == order_list[o]) break;
			}
			if (o == n_patterns) {
				order_list[n_patterns++] = sigdata->order[n];
			}
		}
	}

	if (!n_patterns) {
		free(order_list);
		return;
	}

	/*for (n = 0; n < n_patterns; n++) {
		dumb_it_optimize_pattern(&sigdata->pattern[order_list[n]]);
	}*/

	for (n = 0; n < n_patterns; n++) {
		for (o = n + 1; o < n_patterns; o++) {
			if ((order_list[n] != order_list[o]) &&
				it_pattern_compare(&sigdata->pattern[order_list[n]], &sigdata->pattern[order_list[o]])) {
				for (p = 0; p < sigdata->n_orders; p++) {
					if (sigdata->order[p] == order_list[o]) {
						sigdata->order[p] = order_list[n];
					}
				}
				for (p = o + 1; p < n_patterns; p++) {
					if (order_list[p] == order_list[o]) {
						order_list[p] = order_list[n];
					}
				}
				order_list[o] = order_list[n];
			}
		}
	}

	qsort(order_list, n_patterns, sizeof(*order_list), &it_order_compare);

	for (n = 0, o = 0; n < n_patterns; n++) {
		if (order_list[n] != order_list[o]) {
			if (++o < n) order_list[o] = order_list[n];
		}
	}

	n_patterns = o + 1;

	pattern = malloc(n_patterns * sizeof(*pattern));
	if (!pattern) {
		free(order_list);
		return;
	}

	for (n = 0; n < n_patterns; n++) {
		pattern[n] = sigdata->pattern[order_list[n]];
	}

	for (n = 0; n < sigdata->n_patterns; n++) {
		for (o = 0; o < n_patterns; o++) {
			if (order_list[o] == n) break;
		}
		if (o == n_patterns) {
			if (sigdata->pattern[n].entry)
				free(sigdata->pattern[n].entry);
		}
	}

	free(sigdata->pattern);
	sigdata->pattern = pattern;
	sigdata->n_patterns = n_patterns;

	for (n = 0; n < sigdata->n_orders; n++) {
		for (o = 0; o < n_patterns; o++) {
			if (sigdata->order[n] == order_list[o]) {
				sigdata->order[n] = o;
				break;
			}
		}
	}

	free(order_list);
}